

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void __thiscall cppcms::filters::jsescape::operator()(jsescape *this,ostream *out)

{
  undefined **local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined1 *puStack_c8;
  undefined1 *local_c0;
  streambuf **ppsStack_b8;
  locale local_b0 [8];
  undefined1 local_a8 [128];
  streambuf *local_28;
  ostream *poStack_20;
  undefined4 local_18;
  undefined1 local_12;
  
  local_e8 = (undefined **)booster::locale::ios_info::domain_id;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0;
  puStack_c8 = (undefined1 *)0x0;
  local_c0 = (undefined1 *)0x0;
  ppsStack_b8 = (streambuf **)0x0;
  std::locale::locale(local_b0);
  ppsStack_b8 = &local_28;
  puStack_c8 = local_a8;
  local_28 = (streambuf *)0x0;
  poStack_20 = (ostream *)0x0;
  local_e8 = &PTR__filterbuf_0028bcc8;
  local_18 = 0x3030755c;
  local_12 = 0;
  local_c0 = puStack_c8;
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::release
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)&local_e8);
  poStack_20 = out;
  local_28 = (streambuf *)std::ios::rdbuf((streambuf *)(out + *(long *)(*(long *)out + -0x18)));
  (*(this->obj_).to_stream_)(out,(this->obj_).ptr_);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::release
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)&local_e8);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::~filterbuf
            ((filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128> *)&local_e8);
  return;
}

Assistant:

void jsescape::operator()(std::ostream &out) const
	{
		jsescape_buf sb;
		sb.steal(out);
		obj_(out);
		sb.release();
	}